

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav_ins_motion.c
# Opt level: O0

void fsnav_ins_motion_vertical_damping(void)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double local_d0;
  double local_c8;
  double w;
  double K [2];
  double S [3];
  double local_88;
  double y [2];
  double h [2];
  double s;
  double z;
  double v;
  double x;
  double dt;
  double sqrt2;
  double vvs_def;
  char vvs_token [23];
  
  vvs_def = (double)0x6c61636974726576;
  builtin_strncpy(vvs_token,"_damping_stdev",0xf);
  if (fsnav->imu != (fsnav_imu *)0x0) {
    if (fsnav->mode == 0) {
      fsnav_ins_motion_vertical_damping::t0 = -1.0;
      fsnav_ins_motion_vertical_damping::vvs =
           fsnav_ins_motion_parse_double
                     ((char *)&vvs_def,fsnav->imu->cfg,fsnav->imu->cfglength,(double *)0x0,1048576.0
                     );
      if (fsnav_ins_motion_vertical_damping::vvs < 0.0) {
        fsnav_ins_motion_vertical_damping::vvs = 1048576.0;
      }
    }
    else if (-1 < fsnav->mode) {
      if (fsnav_ins_motion_vertical_damping::t0 < 0.0) {
        fsnav_ins_motion_vertical_damping::t0 = fsnav->imu->t;
        if ((fsnav->air != (fsnav_air *)0x0) && (fsnav->air->alt_valid != '\0')) {
          fsnav_ins_motion_vertical_damping::air_alt_last = fsnav->air->alt;
        }
      }
      else {
        dVar1 = fsnav->imu->t - fsnav_ins_motion_vertical_damping::t0;
        fsnav_ins_motion_vertical_damping::t0 = fsnav->imu->t;
        if (0.0 < dVar1) {
          if ((fsnav->imu->sol).llh_valid == '\0') {
            v = 0.0;
          }
          else {
            v = (fsnav->imu->sol).llh[2];
          }
          if ((fsnav->imu->sol).v_valid == '\0') {
            z = 0.0;
          }
          else {
            z = (fsnav->imu->sol).v[2];
          }
          local_88 = v;
          y[0] = z;
          K[1] = dVar1 * 1048576.0;
          if ((fsnav->imu->sol).v_valid != '\0') {
            y[1] = 0.0;
            fsnav_linal_kalman_update
                      (&local_88,K + 1,&w,0.0,y + 1,fsnav_ins_motion_vertical_damping::vvs,2);
          }
          if (fsnav->air != (fsnav_air *)0x0) {
            if ((fsnav->air->alt_valid != '\0') && ((fsnav->imu->sol).llh_valid != '\0')) {
              if (fsnav->air->alt_std <= 0.0) {
                local_c8 = fsnav_ins_motion_vertical_damping::vvs;
              }
              else {
                local_c8 = fsnav->air->alt_std;
              }
              y[1] = 2.0;
              fsnav_linal_kalman_update
                        (&local_88,K + 1,&w,
                         fsnav->air->alt + fsnav_ins_motion_vertical_damping::air_alt_last,y + 1,
                         local_c8 * 1.4142135623730951,2);
              y[1] = 0.0;
              fsnav_linal_kalman_update
                        (&local_88,K + 1,&w,
                         fsnav->air->alt - fsnav_ins_motion_vertical_damping::air_alt_last,y + 1,
                         local_c8 * 1.4142135623730951,2);
              fsnav_ins_motion_vertical_damping::air_alt_last = fsnav->air->alt;
            }
            if ((fsnav->air->vv_valid != '\0') && ((fsnav->imu->sol).v_valid != '\0')) {
              if (fsnav->air->vv_std <= 0.0) {
                local_d0 = fsnav_ins_motion_vertical_damping::vvs;
              }
              else {
                local_d0 = fsnav->air->vv_std;
              }
              fsnav_linal_kalman_update
                        (&local_88,K + 1,&w,fsnav->air->vv - (fsnav->imu->sol).v[2],y + 1,local_d0,2
                        );
            }
          }
          dVar2 = sqrt(K[1] * K[1] + 0.0);
          dVar3 = dVar1 * 1.0 + dVar2;
          if ((fsnav->imu->sol).llh_valid != '\0') {
            (fsnav->imu->sol).llh[2] = local_88;
          }
          if ((fsnav->imu->sol).v_valid != '\0') {
            (fsnav->imu->sol).llh[2] =
                 ((dVar2 * 2.0) / dVar3) * (y[0] - z) * dVar1 + (fsnav->imu->sol).llh[2];
            (fsnav->imu->sol).v[2] = y[0];
          }
          if ((fsnav->imu->sol).llh_valid != '\0') {
            (fsnav->imu->sol).v[2] =
                 (((dVar1 * 2.0) / dVar3) * (local_88 - v)) / dVar1 + (fsnav->imu->sol).v[2];
          }
        }
      }
    }
  }
  return;
}

Assistant:

void fsnav_ins_motion_vertical_damping(void) {

	const char vvs_token[] = "vertical_damping_stdev"; // vertical velocity stdev parameter name in configuration

	const double 
		vvs_def = (double)(0x100000),                  // 2^20, vertical velocity stdev default value
		sqrt2   = 1.4142135623730951;                  // sqrt(2)

	static double 
		t0           = -1, // previous time
		vvs          =  0, // vertical velocity stdev
		air_alt_last =  0; // previous value of air altitude

	double 
		dt,	  // time step
		x,    // inertial altitude
		v,    // inertial vertical velocity
		z,    // reference information
		s,    // reference information a priori stdev
		h[2], // model coefficients
		y[2], // algorithm state vector
		S[3], // upper-triangular part of cobariance Cholesky factorization
		K[2], // Kalman gain
		w;    // weight


	// check if imu data has been initialized
	if (fsnav->imu == NULL)
		return;

	if (fsnav->mode == 0) {		// init

		// reset time
		t0 = -1;
		// parse vertical velocity stdev from configuration string
		vvs = fsnav_ins_motion_parse_double(vvs_token, fsnav->imu->cfg, fsnav->imu->cfglength, NULL, vvs_def);
		if (vvs < 0)
			vvs = vvs_def;

	}

	else if (fsnav->mode < 0) {	// termination
		// do nothing
	}
	else						// main cycle
	{
		// time variables
		if (t0 < 0) {
			t0 = fsnav->imu->t;
			if (fsnav->air != NULL && fsnav->air->alt_valid)
				air_alt_last = fsnav->air->alt;
			return;
		}
		dt = fsnav->imu->t - t0;
		t0 = fsnav->imu->t;
		if (dt <= 0)
			return;
		// estimation init 
		if (fsnav->imu->sol.llh_valid) x = fsnav->imu->sol.llh[2]; else x = 0;
		if (fsnav->imu->sol.  v_valid) v = fsnav->imu->sol.  v[2]; else v = 0;
		y[0] = x, y[1] = v;
		S[0] = vvs_def*dt, S[1] = 0, S[2] = 1;
		// zero vertical velocity
		if (fsnav->imu->sol.v_valid) {
			s = vvs;
			z = 0.0;
			h[0] = 0, h[1] = 1;
			fsnav_linal_kalman_update(y,S,K, z,h,s, 2);
		}
		// check for air data
		if (fsnav->air != NULL) {
			if (fsnav->air->alt_valid && fsnav->imu->sol.llh_valid) { // altitude data present
				// altitude
				s = sqrt2*( (fsnav->air->alt_std > 0) ? (fsnav->air->alt_std) : vvs );
				z = fsnav->air->alt + air_alt_last; // decorrelated with velocity information
				h[0] = 2, h[1] = -dt;
				fsnav_linal_kalman_update(y,S,K, z,h,s, 2);
				// altitude rate of change
				z = fsnav->air->alt - air_alt_last; // decorrelated with altitude information
				h[0] = 0, h[1] = dt;
				fsnav_linal_kalman_update(y,S,K, z,h,s, 2);
				air_alt_last = fsnav->air->alt;
			}
			if (fsnav->air->vv_valid && fsnav->imu->sol.v_valid) { // vertical velocity data present
				z = fsnav->air->vv - fsnav->imu->sol.v[2];
				s = (fsnav->air-> vv_std > 0) ? (fsnav->air-> vv_std) : vvs;
				fsnav_linal_kalman_update(y,S,K, z,h,s, 2);
			}
		}

		// check for gnss data
		//
		// TBD
		//

		// vertical channel correction
		s = sqrt(S[0]*S[0] + S[1]*S[1]);  // altitude stdev estimate
		w = s + S[2]*dt;                  // sum of altitude stdev and velocity contribution into stdev
		if (fsnav->imu->sol.llh_valid) 
			fsnav->imu->sol.llh[2] = y[0]; // replace altitude by its estimated value
		if (fsnav->imu->sol.  v_valid) {
			fsnav->imu->sol.llh[2] += 2*s      /w*(y[1]-v)*dt; // weighted correction to hold dx/dt = v
			fsnav->imu->sol.  v[2] = y[1]; // replace vertical velocity by its estimated value
		}
		if (fsnav->imu->sol.llh_valid) 
			fsnav->imu->sol.  v[2] += 2*S[2]*dt/w*(y[0]-x)/dt; // weighted correction to hold dx/dt = v

	}

}